

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O3

SRes SzDecodeCopy(UInt64 inSize,ILookInStream *inStream,Byte *outBuffer)

{
  size_t sVar1;
  SRes SVar2;
  void *inBuf;
  size_t local_40;
  void *local_38;
  
  if (inSize != 0) {
    do {
      local_40 = 0x40000;
      if (inSize < 0x40000) {
        local_40 = inSize;
      }
      SVar2 = (*inStream->Look)(inStream,&local_38,&local_40);
      sVar1 = local_40;
      if (SVar2 != 0) {
        return SVar2;
      }
      if (local_40 == 0) {
        return 6;
      }
      memcpy(outBuffer,local_38,local_40);
      SVar2 = (*inStream->Skip)(inStream,sVar1);
      if (SVar2 != 0) {
        return SVar2;
      }
      outBuffer = outBuffer + sVar1;
      inSize = inSize - sVar1;
    } while (inSize != 0);
  }
  return 0;
}

Assistant:

static SRes SzDecodeCopy(UInt64 inSize, ILookInStream *inStream, Byte *outBuffer)
{
  while (inSize > 0)
  {
    const void *inBuf;
    size_t curSize = (1 << 18);
    if (curSize > inSize)
      curSize = (size_t)inSize;
    RINOK(inStream->Look(inStream, &inBuf, &curSize));
    if (curSize == 0)
      return SZ_ERROR_INPUT_EOF;
    memcpy(outBuffer, inBuf, curSize);
    outBuffer += curSize;
    inSize -= curSize;
    RINOK(inStream->Skip((void *)inStream, curSize));
  }
  return SZ_OK;
}